

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::MemoryCommitmentAllocateOnlyTestInstance::iterate
          (TestStatus *__return_storage_ptr__,MemoryCommitmentAllocateOnlyTestInstance *this)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  VkPhysicalDevice physicalDevice_00;
  VkDevice device_00;
  InstanceInterface *vk;
  Handle<(vk::HandleType)7> *pHVar4;
  TestContext *this_00;
  MessageBuilder *this_01;
  allocator<char> local_4e1;
  string local_4e0;
  uint local_4c0;
  allocator<char> local_4b9;
  string local_4b8;
  MessageBuilder local_498;
  TestLog *local_318;
  TestLog *log;
  deUint64 local_300;
  undefined1 local_2f8 [8];
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkMemoryAllocateInfo memAllocInfo;
  uint local_2b0;
  int i_1;
  deUint32 memoryTypeIndex;
  int i;
  VkDeviceSize allocSize [10];
  ulong local_250;
  VkDeviceSize pCommittedMemoryInBytes;
  int arrayLength;
  VkMemoryPropertyFlags propertyFlag;
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  MemoryCommitmentAllocateOnlyTestInstance *this_local;
  
  physicalDevice_00 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pMemoryProperties.memoryHeaps[0xf]._8_8_ =
       Context::getDeviceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&arrayLength,vk,physicalDevice_00);
  pCommittedMemoryInBytes._4_4_ = 0x10;
  pCommittedMemoryInBytes._0_4_ = 10;
  local_250 = 0;
  for (i_1 = 0; i_1 < 10; i_1 = i_1 + 1) {
    iVar3 = rand();
    *(long *)(&memoryTypeIndex + (long)i_1 * 2) = (long)(iVar3 % 1000 + 1);
  }
  local_2b0 = 0;
  do {
    if (0x1f < local_2b0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"Pass",&local_4e1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      return __return_storage_ptr__;
    }
    if ((pMemoryProperties.memoryTypes[(ulong)local_2b0 - 1].propertyFlags & 0x10) == 0x10) {
      for (memAllocInfo._28_4_ = 0; (int)memAllocInfo._28_4_ < 10;
          memAllocInfo._28_4_ = memAllocInfo._28_4_ + 1) {
        memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._0_4_ = 5;
        ::vk::allocateMemory
                  ((Move<vk::Handle<(vk::HandleType)7>_> *)local_2f8,
                   (DeviceInterface *)pMemoryProperties.memoryHeaps[0xf]._8_8_,device_00,
                   (VkMemoryAllocateInfo *)
                   &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
                   (VkAllocationCallbacks *)0x0);
        uVar2 = pMemoryProperties.memoryHeaps[0xf]._8_8_;
        pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::get
                           ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_2f8);
        local_300 = pHVar4->m_internal;
        (**(code **)(*(long *)uVar2 + 0x58))(uVar2,device_00,local_300,&local_250);
        if (local_250 != 0) {
          this_00 = Context::getTestContext((this->super_TestInstance).m_context);
          local_318 = tcu::TestContext::getLog(this_00);
          tcu::TestLog::operator<<(&local_498,local_318,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          this_01 = tcu::MessageBuilder::operator<<
                              (&local_498,
                               (char (*) [52])"Warning: Memory commitment not null before binding.")
          ;
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_498);
        }
        bVar1 = *(ulong *)(&memoryTypeIndex + (long)(int)memAllocInfo._28_4_ * 2) < local_250;
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Fail",&local_4b9)
          ;
          tcu::TestStatus::fail(__return_storage_ptr__,&local_4b8);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::allocator<char>::~allocator(&local_4b9);
        }
        local_4c0 = (uint)bVar1;
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
                  ((Move<vk::Handle<(vk::HandleType)7>_> *)local_2f8);
        if (local_4c0 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
    local_2b0 = local_2b0 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MemoryCommitmentAllocateOnlyTestInstance::iterate(void)
{
	const VkPhysicalDevice					physicalDevice			= m_context.getPhysicalDevice();
	const VkDevice							device					= m_context.getDevice();
	const InstanceInterface&				vki						= m_context.getInstanceInterface();
	const DeviceInterface&					vkd						= m_context.getDeviceInterface();
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties		= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkMemoryPropertyFlags				propertyFlag			= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const int								arrayLength				= 10;
	VkDeviceSize							pCommittedMemoryInBytes = 0u;
	VkDeviceSize							allocSize[arrayLength];

	// generating random allocation sizes
	for (int i = 0; i < arrayLength; ++i)
	{
		allocSize[i] = rand() % 1000 + 1;
	}

	for (deUint32 memoryTypeIndex = 0u; memoryTypeIndex < VK_MAX_MEMORY_TYPES; ++memoryTypeIndex) //for memoryTypes
	{
		if((pMemoryProperties.memoryTypes[memoryTypeIndex].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			for (int i = 0; i < arrayLength; ++i)
			{
				const VkMemoryAllocateInfo	memAllocInfo =
				{
					VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType		sType
					NULL,									//	const void*			pNext
					allocSize[i],							//	VkDeviceSize		allocationSize
					memoryTypeIndex							//	deUint32			memoryTypeIndex
				};

				Move<VkDeviceMemory> memory = allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);

				vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
				if(pCommittedMemoryInBytes != 0)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << TestLog::Message << "Warning: Memory commitment not null before binding." << TestLog::EndMessage;
				}
				if(pCommittedMemoryInBytes > allocSize[i])
					return tcu::TestStatus::fail("Fail");

			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}